

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmMul(word *c,word *a,word *b,qr_o *r,void *stack)

{
  word *in_RCX;
  void *in_RDX;
  size_t in_RSI;
  word *in_RDI;
  word *in_R8;
  size_t unaff_retaddr;
  word *prod;
  void *in_stack_ffffffffffffffc8;
  word *mod;
  
  mod = in_R8 + in_RCX[6] * 2;
  zzMul((word *)stack,prod,unaff_retaddr,in_RDI,in_RSI,in_RDX);
  zzRed(in_RCX,mod,(size_t)in_R8,in_stack_ffffffffffffffc8);
  wwCopy(in_RDI,in_R8,in_RCX[6]);
  return;
}

Assistant:

static void zmMul(word c[], const word a[], const word b[],
	const qr_o* r, void* stack)
{
	word* prod = (word*)stack;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	ASSERT(zmIsIn(b, r));
	stack = prod + 2 * r->n;
	zzMul(prod, a, r->n, b, r->n, stack);
	zzRed(prod, r->mod, r->n, stack);
	wwCopy(c, prod, r->n);
}